

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_parser.hpp
# Opt level: O3

void __thiscall
jsoncons::csv::basic_csv_parser<char,_std::allocator<char>_>::reinitialize
          (basic_csv_parser<char,_std::allocator<char>_> *this)

{
  pointer pcVar1;
  pointer pcVar2;
  
  this->state_ = start;
  this->column_ = 1;
  this->line_ = 1;
  this->nesting_depth_ = 3;
  this->column_index_ = 0;
  this->level_ = 0;
  this->depth_ = 0;
  this->offset_ = 0;
  this->begin_input_ = (char *)0x0;
  this->input_end_ = (char *)0x0;
  this->input_ptr_ = (char *)0x0;
  this->more_ = true;
  this->header_line_ = 1;
  detail::m_columns_filter<char,_std::allocator<char>_>::reset(&this->m_columns_filter_);
  pcVar1 = (this->stack_).
           super__Vector_base<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->stack_).
      super__Vector_base<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>._M_impl.
      super__Vector_impl_data._M_finish != pcVar1) {
    (this->stack_).
    super__Vector_base<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>._M_impl.
    super__Vector_impl_data._M_finish = pcVar1;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase(&this->column_names_,
             (this->column_names_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + this->min_column_names_,
             (this->column_names_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  pcVar2 = (this->state_stack_).
           super__Vector_base<jsoncons::csv::csv_parse_state,_std::allocator<jsoncons::csv::csv_parse_state>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->state_stack_).
      super__Vector_base<jsoncons::csv::csv_parse_state,_std::allocator<jsoncons::csv::csv_parse_state>_>
      ._M_impl.super__Vector_impl_data._M_finish != pcVar2) {
    (this->state_stack_).
    super__Vector_base<jsoncons::csv::csv_parse_state,_std::allocator<jsoncons::csv::csv_parse_state>_>
    ._M_impl.super__Vector_impl_data._M_finish = pcVar2;
  }
  (this->buffer_)._M_string_length = 0;
  *(this->buffer_)._M_dataplus._M_p = '\0';
  initialize(this);
  return;
}

Assistant:

void reinitialize()
    {
        state_ = csv_parse_state::start;
        column_ = 1;
        line_ = 1;
        nesting_depth_ = default_depth;
        column_index_ = 0;
        level_ = 0;
        depth_ = 0;
        offset_ = 0;
        begin_input_ = nullptr;
        input_end_ = nullptr;
        input_ptr_ = nullptr;
        more_ = true;
        header_line_ = 1;
        m_columns_filter_.reset();
        stack_.clear();
        column_names_.erase(column_names_.begin() + min_column_names_, column_names_.end());
        state_stack_.clear();
        buffer_.clear();

        initialize();
    }